

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exomizer.h
# Opt level: O1

int getflag(int argc,char **argv,char *flags)

{
  int iVar1;
  char cVar2;
  char **ppcVar3;
  char **ppcVar4;
  char *pcVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  char **ppcVar9;
  char **ppcVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  int __c;
  
  iVar12 = flagind;
  flagarg = (char *)0x0;
  lVar11 = (long)flagind;
  iVar13 = flagind;
  if (flagind < argc) {
    ppcVar4 = argv + lVar11;
    do {
      iVar13 = flagind;
      if (**ppcVar4 == '-') break;
      flagind = flagind + 1;
      ppcVar4 = ppcVar4 + 1;
      iVar13 = argc;
    } while (argc != flagind);
  }
  iVar8 = -1;
  if (iVar13 != argc) {
    pcVar5 = argv[iVar13];
    cVar2 = pcVar5[1];
    __c = (int)cVar2;
    iVar6 = iVar13;
    if ((((__c != 0x2d) || (pcVar5[2] != '\0')) &&
        (iVar7 = 0x3f, iVar8 = iVar7, flagflag = __c, cVar2 != '\0')) && (cVar2 != ':')) {
      if (pcVar5[2] != '\0') {
        flagarg = pcVar5 + 2;
      }
      pcVar5 = strchr(flags,__c);
      if (pcVar5 != (char *)0x0) {
        if (flagarg == (char *)0x0) {
          iVar8 = __c;
          if ((pcVar5[1] == ':') &&
             (iVar1 = iVar13 + 1, iVar8 = iVar7, iVar6 = iVar12, iVar1 != argc)) {
            flagarg = argv[iVar1];
            iVar8 = __c;
            iVar6 = iVar13;
            flagind = iVar1;
          }
        }
        else {
          iVar8 = 0x3f;
          if (pcVar5[1] == ':') {
            iVar8 = __c;
          }
        }
      }
    }
    if (iVar12 < iVar6 && iVar6 <= flagind) {
      ppcVar4 = argv + (long)iVar6 + -1;
      if (argv + lVar11 < ppcVar4) {
        ppcVar3 = argv + lVar11;
        do {
          ppcVar10 = ppcVar3 + 1;
          pcVar5 = *ppcVar3;
          *ppcVar3 = *ppcVar4;
          *ppcVar4 = pcVar5;
          ppcVar4 = ppcVar4 + -1;
          ppcVar3 = ppcVar10;
        } while (ppcVar10 < ppcVar4);
      }
      ppcVar4 = argv + flagind;
      if (argv + iVar6 < ppcVar4) {
        ppcVar10 = ppcVar4;
        ppcVar3 = argv + iVar6;
        do {
          ppcVar9 = ppcVar3 + 1;
          pcVar5 = *ppcVar3;
          *ppcVar3 = *ppcVar10;
          *ppcVar10 = pcVar5;
          ppcVar10 = ppcVar10 + -1;
          ppcVar3 = ppcVar9;
        } while (ppcVar9 < ppcVar10);
      }
      if (argv + lVar11 < ppcVar4) {
        ppcVar3 = argv + lVar11;
        do {
          ppcVar10 = ppcVar3 + 1;
          pcVar5 = *ppcVar3;
          *ppcVar3 = *ppcVar4;
          *ppcVar4 = pcVar5;
          ppcVar4 = ppcVar4 + -1;
          ppcVar3 = ppcVar10;
        } while (ppcVar10 < ppcVar4);
      }
    }
    iVar12 = (iVar12 - iVar6) + flagind + 1;
  }
  flagind = iVar12;
  return iVar8;
}

Assistant:

int getflag(int argc, char **argv, const char *flags)
{
    int argstart, flagstart, c;
    const char *flagp;

    c = -1;
    flagarg = NULL;
    argstart = flagind;
    flagstart = argc;

    /* skip over non-flags */
    while (flagind < argc && argv[flagind][0] != '-')
    {
        ++flagind;
    }
    if (flagind == argc)
    {
        /* no more args */
        flagind = argstart;
        return c;
    }
    /* we have an arg to work with */
    do
    {
        flagstart = flagind;
        if (argv[flagind][1] == '-' && argv[flagind][2] == '\0')
        {
            /* stop parsing at '--' flag */
            break;
        }
        c = flagflag = argv[flagind][1];
        if (c == ':' || c == '\0')
        {
            /* this is an illegal flag */
            c = '?';
            break;
        }
        /* flag with arg */
        if (argv[flagind][2] != '\0')
        {
            /* flag-arg in same argv[] */
            flagarg = argv[flagind] + 2;
        }
        flagp = strchr(flags, c);
        if (flagp == NULL)
        {
            /* this is an unknown flag */
            c = '?';
            break;
        }
        if (flagarg != NULL || flagp[1] != ':')
        {
            if (flagarg != NULL && flagp[1] != ':')
            {
                /* error, a simple flag with an argument */
                c = '?';
            }
            break;
        }

        /* flag-arg is in the next argv[] */
        if (flagind + 1 == argc)
        {
            /* auahh, no flag-arg */
            flagstart = argstart;
            c = '?';
            break;
        }
        flagarg = argv[++flagind];
    } while (0);
    /* skip to next arg */
    ++flagind;

    if (flagstart < flagind && argstart < flagstart)
    {
        /* we have found some args
         * we have also skipped over some non-args
         * shuffle the non-flag arg to the end of argv */
        reverse(argv, argstart, flagstart);
        reverse(argv, flagstart, flagind);
        reverse(argv, argstart, flagind);
    }
    flagind = argstart + flagind - flagstart;

    return c;
}